

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::SetRawIssueAssetRequest,cfd::js::api::json::SetRawIssueAssetResponse,cfd::js::api::SetRawIssueAssetRequestStruct,cfd::js::api::SetRawIssueAssetResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  SetRawIssueAssetResponseStruct response;
  SetRawIssueAssetResponse res;
  SetRawIssueAssetRequestStruct request;
  SetRawIssueAssetRequest req;
  string local_2c8;
  SetRawIssueAssetResponseStruct local_2a8;
  ErrorResponse local_1c8;
  SetRawIssueAssetRequestStruct local_110;
  SetRawIssueAssetRequest local_a0;
  
  SetRawIssueAssetRequest::SetRawIssueAssetRequest(&local_a0);
  core::JsonClassBase<cfd::js::api::json::SetRawIssueAssetRequest>::Deserialize
            (&local_a0.super_JsonClassBase<cfd::js::api::json::SetRawIssueAssetRequest>,
             (string *)this);
  SetRawIssueAssetRequest::ConvertToStruct(&local_110,&local_a0);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_2a8,request_message,&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_2a8.error.code == 0) {
      SetRawIssueAssetResponse::SetRawIssueAssetResponse((SetRawIssueAssetResponse *)&local_1c8);
      SetRawIssueAssetResponse::ConvertFromStruct((SetRawIssueAssetResponse *)&local_1c8,&local_2a8)
      ;
      core::JsonClassBase<cfd::js::api::json::SetRawIssueAssetResponse>::Serialize_abi_cxx11_
                (&local_2c8,
                 (JsonClassBase<cfd::js::api::json::SetRawIssueAssetResponse> *)&local_1c8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      SetRawIssueAssetResponse::~SetRawIssueAssetResponse((SetRawIssueAssetResponse *)&local_1c8);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1c8,&local_2a8.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_2c8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1c8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      local_1c8.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_1c8.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1c8.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.error.message._M_dataplus._M_p != &local_2a8.error.message.field_2) {
      operator_delete(local_2a8.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.error.type._M_dataplus._M_p != &local_2a8.error.type.field_2) {
      operator_delete(local_2a8.error.type._M_dataplus._M_p);
    }
    std::
    vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
    ::~vector(&local_2a8.issuances);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.hex._M_dataplus._M_p != &local_2a8.hex.field_2) {
      operator_delete(local_2a8.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_110.ignore_items._M_t);
    std::
    vector<cfd::js::api::IssuanceDataRequestStruct,_std::allocator<cfd::js::api::IssuanceDataRequestStruct>_>
    ::~vector(&local_110.issuances);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.tx._M_dataplus._M_p != &local_110.tx.field_2) {
      operator_delete(local_110.tx._M_dataplus._M_p);
    }
    SetRawIssueAssetRequest::~SetRawIssueAssetRequest(&local_a0);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  SetRawIssueAssetResponse::~SetRawIssueAssetResponse((SetRawIssueAssetResponse *)&local_1c8);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  SetRawIssueAssetResponseStruct::~SetRawIssueAssetResponseStruct(&local_2a8);
  SetRawIssueAssetRequestStruct::~SetRawIssueAssetRequestStruct(&local_110);
  SetRawIssueAssetRequest::~SetRawIssueAssetRequest(&local_a0);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}